

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_test.cpp
# Opt level: O2

void testDefaultHelp_SingleValueOptionAdded_ShouldSucceed(void)

{
  __type _Var1;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator<char> local_2b5;
  allocator<char> local_2b4;
  allocator_type local_2b3;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_2b2;
  allocator<char> local_2b1;
  Argengine ae;
  _Any_data local_2a8;
  code *local_298;
  code *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string answer;
  string local_240 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  string local_208 [32];
  string local_1e8 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  stringstream ss;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"test",(allocator<char> *)&answer);
  __l._M_len = 1;
  __l._M_array = (iterator)&ss;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_220,__l,(allocator_type *)&local_280);
  juzzlin::Argengine::Argengine(&ae,&local_220,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_220);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&answer,"-f",(allocator<char> *)&local_280);
  std::__cxx11::string::string<std::allocator<char>>(local_240,"--foo",&local_2b1);
  __l_00._M_len = 2;
  __l_00._M_array = &answer;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_1c8,__l_00,&local_2b2,&local_2b3);
  local_2a8._M_unused._M_object = (void *)0x0;
  local_2a8._8_8_ = 0;
  local_290 = std::
              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/help_test/help_test.cpp:95:26)>
              ::_M_invoke;
  local_298 = std::
              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/help_test/help_test.cpp:95:26)>
              ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"Add foo.",&local_2b4);
  std::__cxx11::string::string<std::allocator<char>>(local_208,"FOO",&local_2b5);
  juzzlin::Argengine::addOption(&ae,&local_1c8,&local_2a8,0,local_1e8,local_208);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string(local_1e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_2a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_1c8);
  lVar2 = 0x20;
  do {
    std::__cxx11::string::~string(local_240 + lVar2 + -0x20);
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  juzzlin::Argengine::setOutputStream((ostream *)&ae);
  juzzlin::Argengine::printHelp();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&answer,
             "Usage: test [OPTIONS]\n\nOptions:\n\n-h, --help       Show this help.\n-f, --foo [FOO]  Add foo.\n\n"
             ,(allocator<char> *)&local_280);
  std::__cxx11::stringbuf::str();
  _Var1 = std::operator==(&local_280,&answer);
  if (_Var1) {
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&answer);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    juzzlin::Argengine::~Argengine(&ae);
    return;
  }
  __assert_fail("ss.str() == answer",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/help_test/help_test.cpp"
                ,0x66,"void testDefaultHelp_SingleValueOptionAdded_ShouldSucceed()");
}

Assistant:

void testDefaultHelp_SingleValueOptionAdded_ShouldSucceed()
{
    Argengine ae({ "test" });
    std::stringstream ss;
    ae.addOption(
      { "-f", "--foo" }, [](std::string) {}, false, "Add foo.", "FOO");
    ae.setOutputStream(ss);
    ae.printHelp();
    const std::string answer = "Usage: test [OPTIONS]\n\n"
                               "Options:\n\n"
                               "-h, --help       Show this help.\n"
                               "-f, --foo [FOO]  Add foo.\n\n";
    assert(ss.str() == answer);
}